

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineApplyWithArgumentsObject
          (Inline *this,Instr *callInstr,Instr *argsObjectArgInstr,FunctionJITTimeInfo *funcInfo)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  BailOutInstrTemplate<IR::Instr> *this_00;
  BailOutInfo *bailOutInfo;
  Opnd *newSrc;
  ByteCodeUsesInstr *this_01;
  Instr *pIVar6;
  SymOpnd *pSVar7;
  RegOpnd *newDst;
  IntConstOpnd *newSrc_00;
  SymOpnd *newSrc_01;
  Instr *pIVar8;
  Inline *this_02;
  Instr *insertInstr;
  Instr *local_78;
  Instr *builtInStartInstr;
  Instr *pIStack_68;
  uint argOutCount;
  Instr *implicitThisArgOut;
  Instr *argumentsObjArgOut;
  Instr *local_50;
  Instr *explicitThisArgOut;
  Instr *local_40;
  bool local_31 [8];
  bool safeThis;
  
  argumentsObjArgOut = callInstr->m_next;
  pSVar4 = IR::Opnd::GetStackSym(argsObjectArgInstr->m_src1);
  if ((pSVar4->field_0x18 & 1) == 0) {
    explicitThisArgOut = (Instr *)0x0;
  }
  else {
    explicitThisArgOut = (pSVar4->field_5).m_instrDef;
  }
  IR::Instr::ReplaceSrc1(argsObjectArgInstr,explicitThisArgOut->m_dst);
  pIStack_68 = (Instr *)0x0;
  local_50 = (Instr *)0x0;
  implicitThisArgOut = (Instr *)0x0;
  builtInStartInstr._4_4_ = 0;
  GetArgInstrsForCallAndApply
            (this,callInstr,&stack0xffffffffffffff98,&local_50,&implicitThisArgOut,
             (uint *)((long)&builtInStartInstr + 4));
  pIVar6 = pIStack_68;
  if (pIStack_68 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa13,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar3) goto LAB_005099da;
    *puVar5 = 0;
  }
  if (local_50 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa14,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar3) goto LAB_005099da;
    *puVar5 = 0;
  }
  if (implicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa15,"(argumentsObjArgOut)","argumentsObjArgOut");
    if (!bVar3) goto LAB_005099da;
    *puVar5 = 0;
  }
  local_40 = (Instr *)IR::Opnd::GetStackSym(callInstr->m_src1);
  bVar1 = callInstr->m_src1->field_0xb;
  local_31[0] = false;
  this_02 = this;
  bVar3 = TryOptimizeCallInstrWithFixedMethod
                    (this,callInstr,funcInfo,false,true,false,true,local_31,false,0);
  if (bVar3) {
    if (callInstr->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xa2a,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar3) goto LAB_005099da;
      *puVar5 = 0;
    }
    this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnNotStackArgs,BailOutOnInlineFunction,callInstr,callInstr->m_func);
  }
  else {
    pIVar6 = PrepareInsertionPoint(this_02,callInstr,funcInfo,pIVar6);
    bailOutInfo = IR::Instr::GetBailOutInfo(pIVar6);
    this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnNotStackArgs,BailOutOnInlineFunction,bailOutInfo,callInstr->m_func);
  }
  newSrc = IR::Opnd::Copy(explicitThisArgOut->m_dst,this->topFunc);
  IR::Instr::SetSrc1(&this_00->super_Instr,newSrc);
  IR::Instr::InsertBefore(pIVar6,&this_00->super_Instr);
  if (callInstr->m_opcode == CallIFixed) {
    this_01 = IR::ByteCodeUsesInstr::New(callInstr);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_01,(bool)((bVar1 & 8) >> 3),*(uint *)&local_40->m_next);
    pIVar6 = callInstr;
    IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
  }
  pIVar6 = InsertInlineeBuiltInStartEndTags((Inline *)pIVar6,callInstr,3,&local_78);
  pIVar6->m_opcode = InlineNonTrackingBuiltInEnd;
  local_40 = local_78;
  pSVar4 = IR::Opnd::GetStackSym(local_78->m_src2);
  pIVar6 = (pSVar4->field_5).m_instrDef;
  if ((pIVar6 != (Instr *)0x0 & pSVar4->field_0x18) == 1) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    insertInstr = local_40;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) {
LAB_005099da:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pIVar6 = (pSVar4->field_5).m_instrDef;
    insertInstr = local_40;
  }
  do {
    if ((pIVar6->m_src2 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsSymOpnd(pIVar6->m_src2), !bVar3)) {
LAB_0050983b:
      pIVar8 = (Instr *)0x0;
    }
    else {
      pSVar7 = IR::Opnd::AsSymOpnd(pIVar6->m_src2);
      pSVar4 = Sym::AsStackSym(pSVar7->m_sym);
      bVar3 = StackSym::IsArgSlotSym(pSVar4);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar3) goto LAB_005099da;
        *puVar5 = 0;
      }
      if (((((pSVar4->field_0x18 & 1) == 0) || ((pSVar4->field_5).m_instrDef == (Instr *)0x0)) &&
          (bVar3 = Func::IsInPhase(local_40->m_func,FGPeepsPhase), !bVar3)) &&
         (bVar3 = Func::IsInPhase(local_40->m_func,FGBuildPhase), !bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar3) goto LAB_005099da;
        *puVar5 = 0;
      }
      if ((pSVar4->field_0x18 & 1) == 0) goto LAB_0050983b;
      pIVar8 = (pSVar4->field_5).m_instrDef;
    }
    if (pIVar6->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar6->m_opcode == StartCall) {
        if (pIVar8 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar3) goto LAB_005099da;
          *puVar5 = 0;
        }
        break;
      }
      IR::Instr::Move(pIVar6,insertInstr);
      insertInstr = pIVar6;
    }
    pIVar6 = pIVar8;
  } while (pIVar8 != (Instr *)0x0);
  pIVar6 = IR::Instr::New(StartCall,callInstr->m_func);
  newDst = IR::RegOpnd::New(TyVar,callInstr->m_func);
  IR::Instr::SetDst(pIVar6,&newDst->super_Opnd);
  newSrc_00 = IR::IntConstOpnd::New(2,TyInt32,callInstr->m_func,false);
  IR::Instr::SetSrc1(pIVar6,&newSrc_00->super_Opnd);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  pSVar4 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,2);
  pSVar7 = IR::SymOpnd::New(&pSVar4->super_Sym,0,TyVar,callInstr->m_func);
  pSVar4 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
  newSrc_01 = IR::SymOpnd::New(&pSVar4->super_Sym,0,TyVar,callInstr->m_func);
  pIVar6 = IR::Instr::New(ArgOut_A_FromStackArgs,&pSVar7->super_Opnd,explicitThisArgOut->m_dst,
                          pIVar6->m_dst,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  IR::Instr::ReplaceSrc1(callInstr,pIStack_68->m_src1);
  IR::Instr::ReplaceSrc2(callInstr,&newSrc_01->super_Opnd);
  callInstr->m_opcode = CallIDynamic;
  pIVar6 = IR::Instr::New(ArgOut_A_Dynamic,&newSrc_01->super_Opnd,local_50->m_src1,
                          &pSVar7->super_Opnd,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  return argumentsObjArgOut;
}

Assistant:

IR::Instr * Inline::InlineApplyWithArgumentsObject(IR::Instr * callInstr, IR::Instr * argsObjectArgInstr, const FunctionJITTimeInfo * funcInfo)
{
    IR::Instr* instrNext = callInstr->m_next;
    IR::Instr* ldHeapArguments = argsObjectArgInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    argsObjectArgInstr->ReplaceSrc1(ldHeapArguments->GetDst());

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * argumentsObjArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &argumentsObjArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(argumentsObjArgOut);

    //      BailOnNotEqual  s4.var                  ---------------New additional BAILOUT if not stack args or actuals exceed 16 at runtime.
    //      Bailout: #004e (BailOutOnInlineFunction)
    //      linkOpnd      Argout_FromStackArgs s4.var
    //      linkOpnd1     ArgOut_A_Dynamic  s3.var, linkOpnd
    //                    CallI_Dynamic     s6.var,  linkOpnd1

    IR::Instr* bailOutOnNotStackArgs;
    IR::Instr* bailOutOnNotStackArgsInsertionPoint = implicitThisArgOut;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // If we optimized the call instruction for a fixed function we will have bailed out earlier if the function
    // wasn't what we expected or was not a function at all.  However, we must still check and bail out on heap arguments.
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
    }
    else
    {
        IR::Instr *primaryBailoutInstr = PrepareInsertionPoint(callInstr, funcInfo, implicitThisArgOut);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, primaryBailoutInstr->GetBailOutInfo(), callInstr->m_func);
        bailOutOnNotStackArgsInsertionPoint = primaryBailoutInstr;
    }

    // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
    bailOutOnNotStackArgs->SetSrc1(ldHeapArguments->GetDst()->Copy(this->topFunc));
    bailOutOnNotStackArgsInsertionPoint->InsertBefore(bailOutOnNotStackArgs);

    // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after
    // the bailout on non-stack arguments.
    if (callInstr->m_opcode == Js::OpCode::CallIFixed)
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }

    // Optimize .init.apply(this, arguments);
    IR::Instr* builtInStartInstr;
    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 3, &builtInStartInstr); //3 args (implicit this + explicit this + arguments = 3)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    // Move argouts close to call. Globopt expects this for arguments object tracking.
    IR::Instr* argInsertInstr = builtInStartInstr;
    builtInStartInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, callInstr->m_func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, callInstr->m_func));
    startCall->SetSrc1(IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func)); //2 args (this pointer & ArgOut_A_From_StackArgs for this direct call to init

    callInstr->InsertBefore(startCall);

    StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    IR::SymOpnd* linkOpnd1 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::Opnd *linkOpnd2 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    // This keeps the stack args alive for bailout to recover
    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_FromStackArgs, linkOpnd1, ldHeapArguments->GetDst(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argout);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd2);
    callInstr->m_opcode = Js::OpCode::CallIDynamic;

    argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, linkOpnd2, explicitThisArgOut->GetSrc1(), linkOpnd1, callInstr->m_func); // push explicit this as this pointer
    callInstr->InsertBefore(argout);
    return instrNext;
}